

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
GlassMaterial::sample
          (GlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Vector3f *pVVar3;
  Ray *this_01;
  result_type rVar4;
  Ray *v;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM6 [16];
  Vector3f np;
  Vector3f local_d4;
  Vector3f *local_c8;
  Ray *local_c0;
  undefined1 local_b4 [12];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Vector3f local_84;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Vector2f local_4c;
  Vector2f local_44;
  Vector3f local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  this_00 = rt->g;
  v = (Ray *)&ray->d;
  local_c8 = coe;
  local_c0 = ray;
  operator-((Vector3f *)v);
  auVar7._0_4_ = Vector3f::dot(&local_d4,&hit->norm);
  auVar7._4_60_ = extraout_var;
  local_68 = auVar7._0_16_;
  local_98 = ZEXT416((uint)this->thickness);
  auVar9._0_8_ = CONCAT44(extraout_var._0_4_,auVar7._0_4_) ^ 0x8000000080000000;
  auVar9._8_4_ = extraout_var._4_4_ ^ 0x80000000;
  auVar9._12_4_ = extraout_var._8_4_ ^ 0x80000000;
  auVar9 = vmaxss_avx(auVar9,local_68);
  auVar11._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
  auVar11._8_4_ = auVar9._8_4_ ^ 0x80000000;
  auVar11._12_4_ = auVar9._12_4_ ^ 0x80000000;
  auVar6 = vfnmadd213ss_fma(auVar9,auVar9,SUB6416(ZEXT464(0x3f800000),0));
  auVar6 = vmaxss_avx(ZEXT816(0) << 0x20,auVar6);
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  auVar6 = ZEXT416((uint)(auVar6._0_4_ * this->refractCoef));
  auVar6 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar6._0_4_ < 0.0) {
    local_a8 = auVar9;
    local_78 = auVar11;
    auVar8._0_4_ = sqrtf(auVar6._0_4_);
    auVar8._4_60_ = extraout_var_00;
    auVar6 = auVar8._0_16_;
    auVar11 = local_78;
    auVar9 = local_a8;
  }
  else {
    auVar6 = vsqrtss_avx(auVar6,auVar6);
  }
  fVar5 = this->refractCoef;
  auVar2 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar5),auVar6);
  auVar11 = vfmadd213ss_fma(auVar6,ZEXT416((uint)fVar5),auVar9);
  auVar10._0_4_ = auVar2._0_4_ / auVar11._0_4_;
  auVar10._4_12_ = auVar2._4_12_;
  auVar11 = vfnmadd213ss_fma(auVar9,ZEXT416((uint)fVar5),auVar6);
  auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar5),auVar6);
  fVar5 = auVar11._0_4_ / auVar9._0_4_;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar10,auVar10);
  local_a8._0_4_ = auVar9._0_4_ * 0.5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  auVar9 = vcvtusi2sd_avx512f(in_XMM6,rVar4);
  if ((float)(auVar9._0_8_ / 4294967295.0) <= (float)local_a8._0_4_) {
    Vector2f::Vector2f(&local_4c,&hit->pos);
    Texture::get((Texture *)local_b4,(Vector2f *)&this->reflectColor);
    pVVar3 = local_c8;
    ::operator*(local_c8,(Vector3f *)local_b4);
    Vector3f::operator=(pVVar3,&local_d4);
    ::operator*(&local_84,2.0);
    operator-((Vector3f *)v);
    fVar5 = Vector3f::dot(&hit->norm,&local_3c);
    ::operator*(&local_d4,fVar5);
    operator+(&local_d4,(Vector3f *)v);
    Vector3f::normalize((Vector3f *)local_b4);
    ::operator*(&local_d4,hit->t);
    this_01 = local_c0;
    operator+(&local_c0->o,&local_d4);
    Vector3f::operator=(&this_01->o,&local_84);
  }
  else {
    uVar1 = vcmpss_avx512f(ZEXT416(0) << 0x40,ZEXT416((uint)local_68._0_4_),0xe);
    local_98._0_4_ = (uint)!(bool)((byte)uVar1 & 1) * local_98._0_4_;
    Vector2f::Vector2f(&local_44,&hit->pos);
    Texture::get((Texture *)local_b4,(Vector2f *)&this->refractColor);
    pVVar3 = local_c8;
    ::operator*(local_c8,(Vector3f *)local_b4);
    Vector3f::operator=(pVVar3,&local_d4);
    ::operator*(&local_d4,(float)local_98._0_4_ + hit->t);
    v = local_c0;
    operator+(&local_c0->o,&local_d4);
  }
  Vector3f::operator=(&v->o,(Vector3f *)local_b4);
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
		float t = thickness;
		if (co < 0) co = -co, t=0;
		float si = sqrtf(std::max(1 - co * co, float(0)));
		float si2 = si * refractCoef;
		float co2 = sqrt(1 - si2 * si2);
		float rs = (refractCoef * co2 - co) / (refractCoef * co2 + co);
		float rp = (co2 - refractCoef * co) / (co2 + refractCoef * co);
		float r = (rs * rs + rp * rp) / 2;
		//cerr << co << " " << r << "\n";
//		r = 0.25 + 0.5 * r;
		//Vector3f i1=ray.d, i2;
		if (randf(g) > r) {
			coe = coe * refractColor.get(hit.pos);
			ray.o = ray.pos(hit.t+ t);
		}
		else {
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np;
		}
		/*
		i2 = ray.d;
		if (Vector3f::dot(i1, -hit.norm) < 0) i1 = -i1;
		if (Vector3f::dot(i2, hit.norm) < 0) i2 = -i2;
		Vector3f b=m->BRDF(i1, i2, hit);*/
		/*
		if (b[0] > 2) b[0] = 2;
		if (b[1] > 2) b[1] = 2;
		if (b[2] > 2) b[2] = 2;*/
		//coe = coe * b; //not actually physical but could work
		return 1;
	}